

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_PlayerObj(FParser *this)

{
  int iVar1;
  AActor *pAVar2;
  
  if (this->t_argc == 0) {
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)&this->Script->trigger);
    if (pAVar2 == (AActor *)0x0) goto LAB_004f1768;
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)&this->Script->trigger);
    if (pAVar2->player == (player_t *)0x0) goto LAB_004f1768;
    iVar1 = (int)((long)&pAVar2->player[-0x916e].morphTics / 0x2a0);
  }
  else {
    iVar1 = T_GetPlayerNum(this->t_argv);
  }
  if (iVar1 != -1) {
    (this->t_return).type = 2;
    (this->t_return).value = *(anon_union_8_3_837bfa25_for_value *)(&players + (long)iVar1 * 0x54);
    return;
  }
LAB_004f1768:
  script_error("script not started by player\n");
  return;
}

Assistant:

void FParser::SF_PlayerObj(void)
{
	int plnum;

	if(!t_argc)
	{
		player_t *pl=NULL;
		if (Script->trigger) pl = Script->trigger->player;
		if(pl) plnum = int(pl - players);
		else plnum=-1;
	}
	else
		plnum = T_GetPlayerNum(t_argv[0]);

	if(plnum !=-1)
	{
		t_return.type = svt_mobj;
		t_return.value.mobj = players[plnum].mo;
	}
	else
	{
		script_error("script not started by player\n");
	}
}